

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O2

void Sfm_ComputeInterpolantCheck(Sfm_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  char *__s;
  word uTruth;
  
  Sfm_NtkCreateWindow(p,3,1);
  Sfm_NtkWindowToSolver(p);
  pVVar1 = p->vDivIds;
  pVVar1->nSize = 0;
  iVar2 = Sfm_ObjSatVar(p,6);
  Vec_IntPush(pVVar1,iVar2);
  pVVar1 = p->vDivIds;
  iVar2 = Sfm_ObjSatVar(p,7);
  Vec_IntPush(pVVar1,iVar2);
  uTruth = Sfm_ComputeInterpolant(p);
  if (uTruth == 0x1234567812345678) {
    __s = "The problem is UNDEC.";
  }
  else {
    if (uTruth != 0x8765432187654321) {
      Kit_DsdPrintFromTruth((uint *)&uTruth,2);
      putchar(10);
      return;
    }
    __s = "The problem is SAT.";
  }
  puts(__s);
  return;
}

Assistant:

void Sfm_ComputeInterpolantCheck( Sfm_Ntk_t * p )
{
    int iNode = 3;
    int iDiv0 = 6;
    int iDiv1 = 7;
    word uTruth;
//    int i;
//    Sfm_NtkForEachNode( p, i )
    {
        Sfm_NtkCreateWindow( p, iNode, 1 );
        Sfm_NtkWindowToSolver( p );

        // collect SAT variables of divisors
        Vec_IntClear( p->vDivIds );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv0) );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv1) );

        uTruth = Sfm_ComputeInterpolant( p );

        if ( uTruth == SFM_SAT_SAT )
            printf( "The problem is SAT.\n" );
        else if ( uTruth == SFM_SAT_UNDEC )
            printf( "The problem is UNDEC.\n" );
        else
            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 2 ), printf( "\n" );
    }
}